

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdDivide(EpDouble *epd1,double value)

{
  int iVar1;
  int sign;
  int exponent;
  double tmp;
  EpDouble epd2;
  double value_local;
  EpDouble *epd1_local;
  
  epd2._8_8_ = value;
  iVar1 = EpdIsNan(epd1);
  if ((iVar1 == 0) && (iVar1 = IsNanDouble((double)epd2._8_8_), iVar1 == 0)) {
    iVar1 = EpdIsInf(epd1);
    if ((iVar1 == 0) && (iVar1 = IsInfDouble((double)epd2._8_8_), iVar1 == 0)) {
      if (((double)epd2._8_8_ != 0.0) || (NAN((double)epd2._8_8_))) {
        if ((SUB84(epd1->type,4) >> 0x14 & 0x7ff) != 0x3ff) {
          __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                        ,0x1a0,"void EpdDivide(EpDouble *, double)");
        }
        EpdConvert((double)epd2._8_8_,(EpDouble *)&tmp);
        (epd1->type).value = (epd1->type).value / tmp;
        epd1->exponent = epd1->exponent - epd2.type._0_4_;
        EpdNormalize(epd1);
      }
      else {
        EpdMakeNan(epd1);
      }
    }
    else {
      EpdConvert((double)epd2._8_8_,(EpDouble *)&tmp);
      iVar1 = EpdIsInf(epd1);
      if ((iVar1 == 0) || (iVar1 = IsInfDouble((double)epd2._8_8_), iVar1 == 0)) {
        iVar1 = EpdIsInf(epd1);
        if (iVar1 == 0) {
          EpdMakeZero(epd1,(SUB84(epd1->type,4) ^ tmp._4_4_) >> 0x1f);
        }
        else {
          EpdMakeInf(epd1,(SUB84(epd1->type,4) ^ tmp._4_4_) >> 0x1f);
        }
      }
      else {
        EpdMakeNan(epd1);
      }
    }
  }
  else {
    EpdMakeNan(epd1);
  }
  return;
}

Assistant:

void
EpdDivide(EpDouble *epd1, double value)
{
  EpDouble      epd2;
  double        tmp;
  int           exponent;

  if (EpdIsNan(epd1) || IsNanDouble(value)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || IsInfDouble(value)) {
    int sign;

    EpdConvert(value, &epd2);
    if (EpdIsInf(epd1) && IsInfDouble(value)) {
      EpdMakeNan(epd1);
    } else if (EpdIsInf(epd1)) {
      sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
      EpdMakeInf(epd1, sign);
    } else {
      sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
      EpdMakeZero(epd1, sign);
    }
    return;
  }

  if (value == 0.0) {
    EpdMakeNan(epd1);
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);

  EpdConvert(value, &epd2);
  tmp = epd1->type.value / epd2.type.value;
  exponent = epd1->exponent - epd2.exponent;
  epd1->type.value = tmp;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}